

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O2

bool __thiscall
Assimp::ASEImporter::CanRead(ASEImporter *this,string *pFile,IOSystem *pIOHandler,bool cs)

{
  bool bVar1;
  bool bVar2;
  string extension;
  char *tokens [1];
  
  BaseImporter::GetExtension(&extension,pFile);
  bVar1 = std::operator==(&extension,"ase");
  bVar2 = true;
  if (bVar1) goto LAB_003def69;
  bVar1 = std::operator==(&extension,"ask");
  if (bVar1) goto LAB_003def69;
  if (extension._M_string_length == 0) {
    if (pIOHandler != (IOSystem *)0x0) goto LAB_003def3d;
  }
  else if (pIOHandler != (IOSystem *)0x0 && cs) {
LAB_003def3d:
    tokens[0] = "*3dsmax_asciiexport";
    bVar2 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,tokens,1,200,false,false);
    goto LAB_003def69;
  }
  bVar2 = false;
LAB_003def69:
  std::__cxx11::string::~string((string *)&extension);
  return bVar2;
}

Assistant:

bool ASEImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool cs) const {
    // check file extension
    const std::string extension = GetExtension(pFile);

    if (extension == "ase" || extension == "ask") {
        return true;
    }

    if ((!extension.length() || cs) && pIOHandler) {
        const char* tokens[] = {"*3dsmax_asciiexport"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}